

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_vm *puVar1;
  unqlite_col_record *puVar2;
  unqlite_col *puVar3;
  int iVar4;
  char *pcVar5;
  unqlite_col *pCol;
  unqlite_col *puVar6;
  int iFlag;
  unqlite_col_record *pChunk;
  uint uVar7;
  long nId;
  SyMemBackend *pBackend;
  int nByte;
  SyString sName;
  
  if (argc < 1) {
    pcVar5 = "Missing collection name";
LAB_00116ebb:
    jx9_context_throw_error(pCtx,1,pcVar5);
  }
  else {
    pcVar5 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar5 = "Invalid collection name";
      goto LAB_00116ebb;
    }
    sName.nByte = nByte;
    sName.zString = pcVar5;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      puVar1 = pCol->pVm;
      unqlite_kv_cursor_reset(pCol->pCursor);
      iVar4 = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sName).zString,(pCol->sName).nByte,1);
      if ((iVar4 == 0) && (iVar4 = unqlite_kv_cursor_delete_entry(pCol->pCursor), iVar4 == 0)) {
        for (nId = 0; nId < pCol->nLastid; nId = nId + 1) {
          unqliteCollectionDropRecord(pCol,nId,0,0);
        }
        pBackend = &pCol->pVm->sAlloc;
        pChunk = pCol->pList;
        for (uVar7 = 0; uVar7 < pCol->nRec; uVar7 = uVar7 + 1) {
          puVar2 = pChunk->pNext;
          jx9MemObjRelease(&pChunk->sValue);
          SyMemBackendPoolFree(pBackend,pChunk);
          pChunk = puVar2;
        }
        SyMemBackendFree(pBackend,pCol->apRecord);
        pCol->pList = (unqlite_col_record *)0x0;
        pCol->nRec = 0;
        pCol->nRecSize = 0;
        SyBlobRelease(&pCol->sHeader);
        SyBlobRelease(&pCol->sWorker);
        SyMemBackendFree(&puVar1->sAlloc,(pCol->sName).zString);
        unqliteReleaseCursor(puVar1->pDb,pCol->pCursor);
        if (pCol->pPrevCol == (unqlite_col *)0x0) {
          puVar6 = pCol->pNextCol;
          puVar1->apCol[puVar1->iColSize - 1 & pCol->nHash] = puVar6;
        }
        else {
          puVar6 = pCol->pNextCol;
          pCol->pPrevCol->pNextCol = puVar6;
        }
        iVar4 = 1;
        if (puVar6 != (unqlite_col *)0x0) {
          puVar6->pPrevCol = pCol->pPrevCol;
        }
        if (puVar1->pCol == pCol) {
          puVar1->pCol = puVar1->pCol->pNext;
        }
        puVar6 = pCol->pNext;
        puVar3 = pCol->pPrev;
        if (puVar3 != (unqlite_col *)0x0) {
          puVar3->pNext = puVar6;
        }
        if (puVar6 != (unqlite_col *)0x0) {
          puVar6->pPrev = puVar3;
        }
        puVar1->iCol = puVar1->iCol - 1;
        SyMemBackendPoolFree(&puVar1->sAlloc,pCol);
      }
      else {
        iVar4 = 0;
        unqliteGenErrorFormat
                  (pCol->pVm->pDb,
                   "Cannot remove collection \'%z\' due to a read-only Key/Value storage engine",
                   &pCol->sName);
      }
      goto LAB_00116ecb;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&sName);
  }
  iVar4 = 0;
LAB_00116ecb:
  jx9_result_bool(pCtx,iVar4);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Drop the collection */
	rc = unqliteDropCollection(pCol);
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}